

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientKeepAlive.cpp
# Opt level: O2

void __thiscall
ki::protocol::control::ClientKeepAlive::write_to(ClientKeepAlive *this,ostream *ostream)

{
  Field<unsigned_short> *pFVar1;
  allocator local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  Record record;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)&local_80,"m_session_id",&local_c1);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&record,&local_80,true);
  pFVar1->m_value = this->m_session_id;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"m_milliseconds",&local_c1);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&record,&local_a0,true);
  pFVar1->m_value = this->m_milliseconds;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,"m_minutes",&local_c1);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&record,&local_c0,true);
  pFVar1->m_value = this->m_minutes;
  std::__cxx11::string::~string((string *)&local_c0);
  ki::dml::Record::write_to(&record,ostream);
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void ClientKeepAlive::write_to(std::ostream &ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id")->set_value(m_session_id);
		record.add_field<dml::USHRT>("m_milliseconds")->set_value(m_milliseconds);
		record.add_field<dml::USHRT>("m_minutes")->set_value(m_minutes);
		record.write_to(ostream);
	}